

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void Intra16Preds_SSE2(uint8_t *dst,uint8_t *left,uint8_t *top)

{
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  
  DC16Mode_SSE2(in_RSI,in_RDX,(uint8_t *)0x1667e5);
  VerticalPred_SSE2(in_RSI,in_RDX,0);
  HorizontalPred_SSE2(in_RSI,in_RDX,0);
  TrueMotion_SSE2(top,in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20));
  return;
}

Assistant:

static void Intra16Preds_SSE2(uint8_t* WEBP_RESTRICT dst,
                              const uint8_t* WEBP_RESTRICT left,
                              const uint8_t* WEBP_RESTRICT top) {
  DC16Mode_SSE2(I16DC16 + dst, left, top);
  VerticalPred_SSE2(I16VE16 + dst, top, 16);
  HorizontalPred_SSE2(I16HE16 + dst, left, 16);
  TrueMotion_SSE2(I16TM16 + dst, left, top, 16);
}